

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O1

bool __thiscall Confparse::WriteStr(Confparse *this,char *key,char *value)

{
  byte *__haystack;
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  path *this_00;
  byte *pbVar7;
  path nfn;
  ofstream file;
  char buf [1024];
  path local_2a60;
  undefined1 local_2a38 [248];
  ios_base local_2940 [264];
  char local_2838 [10248];
  
  __haystack = (byte *)this->conf;
  if (__haystack != (byte *)0x0) {
    if (key == (char *)0x0) {
      return false;
    }
    if (value == (char *)0x0) {
      return false;
    }
    if ((this->filepath)._M_pathname._M_string_length == 0) {
      return false;
    }
    sVar5 = strlen(key);
    if ((int)sVar5 != 0) {
      pbVar6 = (byte *)strstr((char *)__haystack,key);
      if (pbVar6 != (byte *)0x0) {
        pbVar1 = (byte *)this->limit;
        if (pbVar6 < pbVar1) {
          do {
            pbVar7 = pbVar6 + (int)sVar5;
            if ((pbVar7 < pbVar1) && (iVar4 = isalnum((int)(char)*pbVar7), iVar4 == 0)) {
              do {
                if ((0x3d < (ulong)*pbVar7) ||
                   ((0x2000000100000200U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) {
                  if ((__haystack <= pbVar7) &&
                     (((pbVar2 = pbVar7, pbVar6 == __haystack || (pbVar6[-1] == 0xd)) ||
                      (pbVar6[-1] == 10)))) goto joined_r0x0010cf30;
                  break;
                }
                pbVar7 = pbVar7 + 1;
              } while (pbVar7 < pbVar1);
            }
            pbVar6 = (byte *)strstr((char *)(pbVar6 + 1),key);
          } while ((pbVar6 != (byte *)0x0) && (pbVar6 < pbVar1));
        }
        std::ofstream::ofstream(local_2a38);
        std::ofstream::open(local_2a38,(_Ios_Openmode)(this->filepath)._M_pathname._M_dataplus._M_p)
        ;
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 != '\0') {
          snprintf(local_2838,0x2800,"%s = %s\r\n",key,value);
          strlen(local_2838);
          std::ostream::write(local_2a38,(long)local_2838);
          std::ostream::flush();
          std::ofstream::close();
          Load(this,&this->filepath,false);
        }
        local_2a38._0_8_ = _VTT;
        *(undefined8 *)(local_2a38 + *(long *)(_VTT + -0x18)) = _roundf;
        std::filebuf::~filebuf((filebuf *)(local_2a38 + 8));
        std::ios_base::~ios_base(local_2940);
        return (bool)cVar3;
      }
      std::filesystem::__cxx11::path::path(&local_2a60,&this->filepath);
      std::filesystem::__cxx11::path::_M_concat(&local_2a60,1,"~");
      std::ofstream::ofstream(local_2a38);
      std::filesystem::rename(&this->filepath,&local_2a60);
      std::ofstream::open(local_2a38,(_Ios_Openmode)(this->filepath)._M_pathname._M_dataplus._M_p);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 != '\0') {
        std::ostream::write(local_2a38,(long)this->conf);
        snprintf(local_2838,0x400,"\r\n%s = %s",key,value);
        std::ostream::write(local_2a38,(long)local_2838);
        std::ostream::flush();
        std::ofstream::close();
        Load(this,&this->filepath,false);
      }
      local_2a38._0_8_ = _VTT;
      *(undefined8 *)(local_2a38 + *(long *)(_VTT + -0x18)) = _roundf;
      std::filebuf::~filebuf((filebuf *)(local_2a38 + 8));
      std::ios_base::~ios_base(local_2940);
      this_00 = &local_2a60;
      goto LAB_0010d148;
    }
  }
  return false;
joined_r0x0010cf30:
  while ((pbVar2 < pbVar1 &&
         ((0xd < *pbVar2 || (pbVar7 = pbVar2, (0x2401U >> (*pbVar2 & 0x1f) & 1) == 0))))) {
    pbVar7 = pbVar1;
    pbVar2 = pbVar2 + 1;
  }
  std::filesystem::__cxx11::path::path((path *)local_2a38,&this->filepath);
  std::filesystem::__cxx11::path::_M_concat((path *)local_2a38,1,"~");
  std::ofstream::ofstream(local_2838);
  std::filesystem::rename(&this->filepath,(path *)local_2a38);
  std::ofstream::open(local_2838,(_Ios_Openmode)(this->filepath)._M_pathname._M_dataplus._M_p);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ostream::write(local_2838,(long)this->conf);
    strlen(value);
    std::ostream::write(local_2838,(long)value);
    std::ostream::write(local_2838,(long)pbVar7);
    std::ofstream::close();
    Load(this,&this->filepath,false);
  }
  std::ofstream::~ofstream(local_2838);
  this_00 = (path *)local_2a38;
LAB_0010d148:
  std::filesystem::__cxx11::path::~path(this_00);
  return (bool)cVar3;
}

Assistant:

bool Confparse::WriteStr(const char *key, const char *value) {
	char *p, *op;
	char *llimit;
	int keylen;

	if (!conf) return false;
	if (filepath.empty()) return false;
	if (!value) return false;
	if (!key) return false;

	keylen = strlen(key);
	if (keylen == 0) return false;
	op = p = strstr(conf, key);
	if (p == NULL) {
		char buf[1024];
		size_t bs;
		auto nfn = filepath;
		nfn += "~";
		ofstream file;

		filesystem::rename(filepath, nfn);
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
		if (!file.is_open()) {
			return false;
		}
		file.write(conf, buffer_size); // write the leadup
		bs = snprintf(buf, sizeof(buf), "\r\n%s = %s", key, value);
		file.write(buf, bs);
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	//	llimit = limit - keylen - 2; // allows for up to 'key=x'
	llimit = limit;
	while (p && p < llimit) {

		/*
		 * Consume the name<whitespace>=<whitespace> trash before we
		 * get to the actual value.  While this does mean things are
		 * slightly less strict in the configuration file text it can
		 * assist in making it easier for people to read it.
		 */
		p = p + keylen;
		if ((p < llimit) && (!isalnum(*p))) {

			while ((p < llimit) && ((*p == '=') || (*p == ' ') || (*p == '\t'))) {
				p++; // get up to the start of the value;
			}

			if ((p < llimit) && (p >= conf)) {

				/*
				 * Check that the location of the strstr() return is
				 * left aligned to the start of the line. This prevents
				 * us picking up trash name=value pairs among the general
				 * text within the file
				 */
				if ((op == conf) || (*(op - 1) == '\r') || (*(op - 1) == '\n')) {
					char *ep = NULL;

					/*
					 * op represents the start of the line/key.
					 * p represents the start of the value.
					 *
					 * we can just dump out to the file up to p and then
					 * print our data
					 */

					/*
					 * Search for the end of the data by finding the end of the line
					 * This will become 'ep', which we'll use as the start of the
					 * rest of the file data we dump back to the config.
					 */
					ep = p;
					while ((ep < limit) && ((*ep != '\0') && (*ep != '\n') && (*ep != '\r'))) {
						ep++;
					}

					{
						auto nfn = filepath;
						nfn += "~";
						ofstream file;

						filesystem::rename(filepath, nfn);
						file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
						if (!file.is_open()) {
							return false;
						}
						file.write(conf, (p - conf));     // write the leadup
						file.write(value, strlen(value)); // write the new data
						file.write(ep, limit - ep);       // write the rest of the file
						file.close();

						Load(filepath);
						return true;
					}
				}
			}
		}
		p  = strstr(op + 1, key);
		op = p;
	}

	/*
	 * If we didn't find our parameter in the config file, then add it.
	 */
	{
		char sep[CONFPARSE_MAX_VALUE_SIZE];
		ofstream file;
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::app);
		if (!file.is_open()) {
			return false;
		}
		snprintf(sep, sizeof(sep), "%s = %s\r\n", key, value);
		file.write(sep, strlen(sep));
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	return false;
}